

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFlowMeterType::~IfcFlowMeterType(IfcFlowMeterType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcFlowControllerType).
                              super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject + -0x18)
  ;
  this_00 = (IfcTypeProduct *)
            ((long)&(this->super_IfcFlowControllerType).super_IfcDistributionFlowElementType.
                    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1d0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1d0) = 0x9aa698;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x9aa800;
  *(undefined8 *)((long)pvVar1 + -0x148) = 0x9aa6c0;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x9aa6e8;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x9aa710;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x9aa738;
  *(undefined8 *)((long)pvVar1 + -0x50) = 0x9aa760;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x9aa788;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x9aa7b0;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x9aa7d8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x9aae28;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x80 = 0x9aaef0;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x9aae50;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x9aae78;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x9aaea0;
  *(undefined8 *)&this_00->field_0x148 = 0x9aaec8;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__009aa838);
  return;
}

Assistant:

IfcFlowMeterType() : Object("IfcFlowMeterType") {}